

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

iterator __thiscall
fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>::operator()
          (arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> *this,handle handle)

{
  size_t *psVar1;
  parse_context *ppVar2;
  char *pcVar3;
  char *pcVar4;
  
  ppVar2 = this->parse_ctx_;
  pcVar3 = this->ptr_;
  if (pcVar3 != (char *)0x0) {
    pcVar4 = (ppVar2->format_str_).data_;
    (ppVar2->format_str_).data_ = pcVar3;
    psVar1 = &(ppVar2->format_str_).size_;
    *psVar1 = (size_t)(pcVar4 + (*psVar1 - (long)pcVar3));
  }
  (*handle.custom_.format)(handle.custom_.value,ppVar2,this->ctx_);
  return (iterator)
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         (this->ctx_->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

iterator operator()(typename basic_format_arg<context_type>::handle handle) {
    if (ptr_) advance_to(*parse_ctx_, ptr_);
    handle.format(*parse_ctx_, ctx_);
    return ctx_.out();
  }